

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_testing::NiceMock<MockNLHandler>_>
::Read(NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_testing::NiceMock<MockNLHandler>_>
       *this,BinaryReader<mp::internal::EndiannessConverter> *bound_reader)

{
  byte bVar1;
  NLHeader *pNVar2;
  BinaryReader<mp::internal::EndiannessConverter> *pBVar3;
  byte *pbVar4;
  MockNLHandler *pMVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  Result_conflict RVar9;
  int iVar10;
  NumericExpr gmock_a3;
  uint uVar11;
  int iVar12;
  bool bVar13;
  undefined1 local_58 [16];
  ArgList local_40;
  
  bVar13 = bound_reader == (BinaryReader<mp::internal::EndiannessConverter> *)0x0;
  pNVar2 = this->header_;
  this->num_vars_and_exprs_ =
       (pNVar2->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_single_objs +
       (pNVar2->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_objs +
       (pNVar2->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_single_cons +
       (pNVar2->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_cons +
       (pNVar2->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_both +
       (pNVar2->super_NLProblemInfo).super_NLProblemInfo_C.num_vars;
  do {
    while( true ) {
      pBVar3 = this->reader_;
      pbVar4 = (byte *)(pBVar3->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar3->super_BinaryReaderBase).super_ReaderBase.token_ = (char *)pbVar4;
      (pBVar3->super_BinaryReaderBase).super_ReaderBase.ptr_ = (char *)(pbVar4 + 1);
      bVar1 = *pbVar4;
      if (bVar1 < 0x62) break;
      if (bVar1 < 0x6b) {
        if (bVar1 == 0x62) {
          if (bVar13) {
            NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,testing::NiceMock<MockNLHandler>>
            ::
            ReadBounds<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,testing::NiceMock<MockNLHandler>>::VarHandler>
                      ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,testing::NiceMock<MockNLHandler>>
                        *)this);
            bVar13 = false;
            if ((this->flags_ & 1) != 0) {
              return;
            }
          }
          else {
            if (bound_reader == (BinaryReader<mp::internal::EndiannessConverter> *)0x0) {
              local_40.field_1.values_ = (Value *)local_58;
              local_58 = (undefined1  [16])0x0;
              local_40.types_ = 0;
              BinaryReaderBase::ReportError
                        (&pBVar3->super_BinaryReaderBase,(CStringRef)0x26348f,&local_40);
            }
            pcVar6 = (bound_reader->super_BinaryReaderBase).super_ReaderBase.ptr_;
            pcVar7 = (bound_reader->super_BinaryReaderBase).super_ReaderBase.start_;
            pcVar8 = (bound_reader->super_BinaryReaderBase).super_ReaderBase.token_;
            (pBVar3->super_BinaryReaderBase).super_ReaderBase.end_ =
                 (bound_reader->super_BinaryReaderBase).super_ReaderBase.end_;
            (pBVar3->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar8;
            (pBVar3->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar6;
            (pBVar3->super_BinaryReaderBase).super_ReaderBase.start_ = pcVar7;
            std::__cxx11::string::_M_assign
                      ((string *)&(pBVar3->super_BinaryReaderBase).super_ReaderBase.name_);
            bound_reader = (BinaryReader<mp::internal::EndiannessConverter> *)0x0;
          }
        }
        else {
          if (bVar1 != 100) goto switchD_001c47ff_caseD_44;
          NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,testing::NiceMock<MockNLHandler>>
          ::
          ReadInitialValues<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,testing::NiceMock<MockNLHandler>>::AlgebraicConHandler>
                    ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,testing::NiceMock<MockNLHandler>>
                      *)this);
        }
      }
      else if (bVar1 == 0x6b) {
        ReadColumnSizes<true>(this);
      }
      else if (bVar1 == 0x72) {
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,testing::NiceMock<MockNLHandler>>
        ::
        ReadBounds<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,testing::NiceMock<MockNLHandler>>::AlgebraicConHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,testing::NiceMock<MockNLHandler>>
                    *)this);
      }
      else {
        if (bVar1 != 0x78) goto switchD_001c47ff_caseD_44;
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,testing::NiceMock<MockNLHandler>>
        ::
        ReadInitialValues<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,testing::NiceMock<MockNLHandler>>::VarHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,testing::NiceMock<MockNLHandler>>
                    *)this);
      }
    }
    switch(bVar1) {
    case 0x43:
      ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_algebraic_cons);
      pBVar3 = this->reader_;
      pMVar5 = &this->handler_->super_MockNLHandler;
      pcVar6 = (pBVar3->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar3->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar6;
      (pBVar3->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar6 + 1;
      ReadNumericExpr(this,*pcVar6,true);
      MockNLHandler::OnUnhandled(pMVar5,"nonlinear constraint");
      break;
    case 0x46:
      ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_funcs);
      uVar11 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt(this->reader_);
      if (1 < uVar11) {
        local_40.field_1.values_ = (Value *)local_58;
        local_58 = (undefined1  [16])0x0;
        local_40.types_ = 0;
        BinaryReaderBase::ReportError
                  (&this->reader_->super_BinaryReaderBase,(CStringRef)0x2668c3,&local_40);
      }
      BinaryReader<mp::internal::EndiannessConverter>::ReadInt<int>(this->reader_);
      BinaryReader<mp::internal::EndiannessConverter>::ReadString(this->reader_);
      MockNLHandler::OnUnhandled(&this->handler_->super_MockNLHandler,"function");
      break;
    case 0x47:
      NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,testing::NiceMock<MockNLHandler>>
      ::
      ReadLinearExpr<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,testing::NiceMock<MockNLHandler>>::ObjHandler>
                ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,testing::NiceMock<MockNLHandler>>
                  *)this);
      break;
    case 0x4a:
      NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,testing::NiceMock<MockNLHandler>>
      ::
      ReadLinearExpr<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,testing::NiceMock<MockNLHandler>>::AlgebraicConHandler>
                ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,testing::NiceMock<MockNLHandler>>
                  *)this);
      break;
    case 0x4b:
      ReadColumnSizes<false>(this);
      break;
    case 0x4c:
      ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_logical_cons);
      pMVar5 = &this->handler_->super_MockNLHandler;
      ReadLogicalExpr(this);
      MockNLHandler::OnUnhandled(pMVar5,"logical constraint");
      break;
    case 0x4f:
      iVar12 = ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_objs);
      iVar10 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt(this->reader_);
      pBVar3 = this->reader_;
      pcVar6 = (pBVar3->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar3->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar6;
      (pBVar3->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar6 + 1;
      gmock_a3 = ReadNumericExpr(this,*pcVar6,true);
      RVar9 = MockNLHandler::NeedObj(&this->handler_->super_MockNLHandler,iVar12);
      if (RVar9) {
        MockNLHandler::OnObj
                  (&this->handler_->super_MockNLHandler,iVar12,(uint)(iVar10 != 0),
                   (Argument3)gmock_a3.id_);
      }
      break;
    case 0x53:
      uVar11 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt(pBVar3);
      if (7 < (int)uVar11) {
        local_40.field_1.values_ = (Value *)local_58;
        local_58 = (undefined1  [16])0x0;
        local_40.types_ = 0;
        BinaryReaderBase::ReportError
                  (&this->reader_->super_BinaryReaderBase,(CStringRef)0x266ffe,&local_40);
      }
      switch(uVar11 & 3) {
      case 0:
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,testing::NiceMock<MockNLHandler>>
        ::
        ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,testing::NiceMock<MockNLHandler>>::VarHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,testing::NiceMock<MockNLHandler>>
                    *)this,uVar11);
        break;
      case 1:
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,testing::NiceMock<MockNLHandler>>
        ::
        ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,testing::NiceMock<MockNLHandler>>::ConHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,testing::NiceMock<MockNLHandler>>
                    *)this,uVar11);
        break;
      case 2:
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,testing::NiceMock<MockNLHandler>>
        ::
        ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,testing::NiceMock<MockNLHandler>>::ObjHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,testing::NiceMock<MockNLHandler>>
                    *)this,uVar11);
        break;
      case 3:
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,testing::NiceMock<MockNLHandler>>
        ::
        ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,testing::NiceMock<MockNLHandler>>::ProblemHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,testing::NiceMock<MockNLHandler>>
                    *)this,uVar11);
      }
      break;
    case 0x56:
      ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_vars,
               this->num_vars_and_exprs_);
      iVar12 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt(this->reader_);
      BinaryReader<mp::internal::EndiannessConverter>::ReadUInt(this->reader_);
      MockNLHandler::OnUnhandled(&this->handler_->super_MockNLHandler,"common expression");
      if (iVar12 != 0) {
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,testing::NiceMock<MockNLHandler>>
        ::ReadLinearExpr<mp::NLHandler<MockNLHandler,BasicTestExpr<0>>::LinearExprHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,testing::NiceMock<MockNLHandler>>
                    *)this,iVar12);
      }
      pBVar3 = this->reader_;
      pMVar5 = &this->handler_->super_MockNLHandler;
      pcVar6 = (pBVar3->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar3->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar6;
      (pBVar3->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar6 + 1;
      ReadNumericExpr(this,*pcVar6,false);
      MockNLHandler::OnUnhandled(pMVar5,"common expression");
      break;
    default:
      if ((bVar1 == 0) && ((byte *)(pBVar3->super_BinaryReaderBase).super_ReaderBase.end_ == pbVar4)
         ) {
        if (!bVar13) {
          return;
        }
        local_40.field_1.values_ = (Value *)local_58;
        local_58 = (undefined1  [16])0x0;
        local_40.types_ = 0;
        BinaryReaderBase::ReportError
                  (&pBVar3->super_BinaryReaderBase,(CStringRef)0x263363,&local_40);
      }
    case 0x44:
    case 0x45:
    case 0x48:
    case 0x49:
    case 0x4d:
    case 0x4e:
    case 0x50:
    case 0x51:
    case 0x52:
    case 0x54:
    case 0x55:
switchD_001c47ff_caseD_44:
      local_40.field_1.values_ = (Value *)local_58;
      local_58 = (undefined1  [16])0x0;
      local_40.types_ = 0;
      BinaryReaderBase::ReportError(&pBVar3->super_BinaryReaderBase,(CStringRef)0x26738a,&local_40);
    }
  } while( true );
}

Assistant:

void NLReader<Reader, Handler>::Read(Reader *bound_reader) {
  bool read_bounds = bound_reader == 0;
  // TextReader::ReadHeader checks that this doesn't overflow.
  num_vars_and_exprs_ = header_.num_vars +
      header_.num_common_exprs_in_both +
      header_.num_common_exprs_in_cons +
      header_.num_common_exprs_in_objs +
      header_.num_common_exprs_in_single_cons +
      header_.num_common_exprs_in_single_objs;
  for (;;) {
    char c = reader_.ReadChar();
    switch (c) {
    case 'C': {
      // Nonlinear part of an algebraic constraint body.
      int index = ReadUInt(header_.num_algebraic_cons);
      reader_.ReadTillEndOfLine();
      handler_.OnAlgebraicCon(index, ReadNumericExpr(true));
      break;
    }
    case 'L': {
      // Logical constraint expression.
      int index = ReadUInt(header_.num_logical_cons);
      reader_.ReadTillEndOfLine();
      handler_.OnLogicalCon(index, ReadLogicalExpr());
      break;
    }
    case 'O': {
      // Objective type and nonlinear part of an objective expression.
      int index = ReadUInt(header_.num_objs);
      int obj_type = reader_.ReadUInt();
      reader_.ReadTillEndOfLine();
      NumericExpr expr = ReadNumericExpr(true);
      if (handler_.NeedObj(index))
        handler_.OnObj(handler_.resulting_obj_index(index),
                       obj_type != 0 ? obj::MAX : obj::MIN,
                       expr);
      break;
    }
    case 'V': {
      // Defined variable definition (must precede V, C, L, O segments
      // where used).
      int expr_index = ReadUInt(header_.num_vars, num_vars_and_exprs_);
      expr_index -= header_.num_vars;
      int num_linear_terms = reader_.ReadUInt();
      int position = reader_.ReadUInt();
      reader_.ReadTillEndOfLine();
      typename Handler::LinearExprHandler
          expr_handler(handler_.BeginCommonExpr(expr_index, num_linear_terms));
      if (num_linear_terms != 0)
        ReadLinearExpr(num_linear_terms, expr_handler);
      handler_.EndCommonExpr(expr_index, ReadNumericExpr(), position);
      break;
    }
    case 'F': {
      // Imported function description.
      int index = ReadUInt(header_.num_funcs);
      int type = reader_.ReadUInt();
      if (type != func::NUMERIC && type != func::SYMBOLIC)
        reader_.ReportError("invalid function type");
      int num_args = reader_.template ReadInt<int>();
      fmt::StringRef name = reader_.ReadName();
      reader_.ReadTillEndOfLine();
      handler_.OnFunction(index, name, num_args, static_cast<func::Type>(type));
      break;
    }
    case 'G':
      // Linear part of an objective expression & gradient sparsity.
      ReadLinearExpr<ObjHandler>();
      break;
    case 'J':
      // Jacobian sparsity & linear terms in constraints.
      ReadLinearExpr<AlgebraicConHandler>();
      break;
    case 'S': {
      // Suffix values.
      int info = reader_.ReadUInt();
      if (info > (internal::SUFFIX_KIND_MASK | suf::FLOAT))
        reader_.ReportError("invalid suffix kind");
      switch (info & internal::SUFFIX_KIND_MASK) {
      case suf::VAR:
        ReadSuffix<VarHandler>(info);
        break;
      case suf::CON:
        ReadSuffix<ConHandler>(info);
        break;
      case suf::OBJ:
        ReadSuffix<ObjHandler>(info);
        break;
      case suf::PROBLEM:
        ReadSuffix<ProblemHandler>(info);
        break;
      }
      break;
    }
    case 'b':
      // Bounds on variables.
      if (read_bounds) {
        ReadBounds<VarHandler>();
        reader_.ptr();
        if ((flags_ & READ_BOUNDS_FIRST) != 0)
          return;
        read_bounds = false;
        break;
      }
      if (!bound_reader)
        reader_.ReportError("duplicate 'b' segment");
      reader_ = *bound_reader;
      bound_reader = 0;
      break;
    case 'r':
      // Bounds on algebraic constraint bodies ("ranges").
      ReadBounds<AlgebraicConHandler>();
      break;
    case 'K':
      // Jacobian sparsity & linear constraint term matrix column sizes
      // (must precede all J segments).
      ReadColumnSizes<false>();
      break;
    case 'k':
      // Jacobian sparsity & linear constraint term matrix cumulative column
      // sizes (must precede all J segments).
      ReadColumnSizes<true>();
      break;
    case 'x':
      // Primal initial guess.
      ReadInitialValues<VarHandler>();
      break;
    case 'd':
      // Dual initial guess.
      ReadInitialValues<AlgebraicConHandler>();
      break;
    case '\0':
      if (reader_.IsEOF()) {
        if (read_bounds)
          reader_.ReportError("segment 'b' missing");
        return;
      }
      // Fall through.
    default:
      reader_.ReportError("invalid segment type");
    }
  }
}